

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_string_match(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int atom)

{
  JSValue JVar1;
  int iVar2;
  ulong uVar3;
  JSValueUnion JVar4;
  ulong uVar5;
  JSValueUnion JVar6;
  int64_t iVar7;
  JSValue v;
  JSValue JVar8;
  JSValue JVar9;
  JSValue JVar10;
  JSValueUnion local_80 [2];
  JSValueUnion local_70;
  int64_t local_68;
  JSValueUnion local_60;
  JSValueUnion local_58;
  int64_t local_50;
  JSValue local_48;
  
  local_68 = this_val.tag;
  local_70 = this_val.u;
  if (((uint)this_val.tag & 0xfffffffe) == 2) {
    JS_ThrowTypeError(ctx,"cannot convert to object");
  }
  else {
    JVar6 = argv->u;
    iVar7 = argv->tag;
    JVar1 = *argv;
    JVar8 = *argv;
    if (((uint)iVar7 & 0xfffffffe) == 2) {
LAB_0016ac8c:
      JVar1.tag = local_68;
      JVar1.u.float64 = local_70.float64;
      local_80 = (JSValueUnion  [2])JS_ToStringInternal(ctx,JVar1,0);
      if (local_80[1]._0_4_ != 6) {
        local_58 = JVar6;
        local_50 = iVar7;
        if (atom == 200) {
          JVar8 = JS_NewStringLen(ctx,"g",1);
          iVar7 = JVar8.tag;
          if ((int)JVar8.tag != 6) {
            uVar3 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
            uVar5 = (ulong)JVar8.u._0_4_;
            iVar2 = 2;
            local_48 = JVar8;
            goto LAB_0016adcb;
          }
        }
        else {
          iVar7 = 3;
          iVar2 = 1;
          uVar5 = 0;
          uVar3 = 0;
LAB_0016adcb:
          JVar6.ptr = (void *)(uVar5 | uVar3);
          JVar8 = JS_CallConstructorInternal
                            (ctx,ctx->regexp_ctor,ctx->regexp_ctor,iVar2,(JSValue *)&local_58,2);
          if ((0xfffffff4 < (uint)iVar7) &&
             (iVar2 = *JVar6.ptr, *(int *)JVar6.ptr = iVar2 + -1, iVar2 < 2)) {
            v.tag = iVar7;
            v.u.ptr = JVar6.ptr;
            __JS_FreeValueRT(ctx->rt,v);
          }
          if ((int)JVar8.tag != 6) {
            JVar8 = JS_InvokeFree(ctx,JVar8,atom,1,(JSValue *)local_80);
            JS_FreeValue(ctx,(JSValue)local_80);
            uVar3 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
            goto LAB_0016aebe;
          }
        }
        if ((0xfffffff4 < local_80[1]._0_4_) &&
           (iVar2 = *local_80[0].ptr, *(int *)local_80[0].ptr = iVar2 + -1, iVar2 < 2)) {
          __JS_FreeValueRT(ctx->rt,(JSValue)local_80);
        }
      }
    }
    else {
      JVar9 = JS_GetPropertyInternal(ctx,*argv,atom,*argv,0);
      if ((uint)JVar9.tag != 6) {
        JVar4 = JVar9.u;
        if ((atom != 200) ||
           (local_60 = JVar9.u, iVar2 = check_regexp_g_flag(ctx,JVar8), JVar4 = local_60, -1 < iVar2
           )) {
          if (((uint)JVar9.tag & 0xfffffffe) != 2) {
            JVar9.u.ptr = JVar4.ptr;
            JVar8 = JS_CallFree(ctx,JVar9,JVar1,1,(JSValue *)&local_70);
            uVar3 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
            goto LAB_0016aebe;
          }
          goto LAB_0016ac8c;
        }
        JVar8.tag = JVar9.tag;
        JVar8.u.ptr = local_60.ptr;
        JS_FreeValue(ctx,JVar8);
      }
    }
  }
  JVar8 = (JSValue)(ZEXT816(6) << 0x40);
  uVar3 = 0;
LAB_0016aebe:
  JVar10.u.ptr = (void *)((ulong)JVar8.u.ptr & 0xffffffff | uVar3);
  JVar10.tag = JVar8.tag;
  return JVar10;
}

Assistant:

static JSValue js_string_match(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv, int atom)
{
    // match(rx), search(rx), matchAll(rx)
    // atom is JS_ATOM_Symbol_match, JS_ATOM_Symbol_search, or JS_ATOM_Symbol_matchAll
    JSValueConst O = this_val, regexp = argv[0], args[2];
    JSValue matcher, S, rx, result, str;
    int args_len;

    if (JS_IsUndefined(O) || JS_IsNull(O))
        return JS_ThrowTypeError(ctx, "cannot convert to object");

    if (!JS_IsUndefined(regexp) && !JS_IsNull(regexp)) {
        matcher = JS_GetProperty(ctx, regexp, atom);
        if (JS_IsException(matcher))
            return JS_EXCEPTION;
        if (atom == JS_ATOM_Symbol_matchAll) {
            if (check_regexp_g_flag(ctx, regexp) < 0) {
                JS_FreeValue(ctx, matcher);
                return JS_EXCEPTION;
            }
        }
        if (!JS_IsUndefined(matcher) && !JS_IsNull(matcher)) {
            return JS_CallFree(ctx, matcher, regexp, 1, &O);
        }
    }
    S = JS_ToString(ctx, O);
    if (JS_IsException(S))
        return JS_EXCEPTION;
    args_len = 1;
    args[0] = regexp;
    str = JS_UNDEFINED;
    if (atom == JS_ATOM_Symbol_matchAll) {
        str = JS_NewString(ctx, "g");
        if (JS_IsException(str))
            goto fail;
        args[args_len++] = (JSValueConst)str;
    }
    rx = JS_CallConstructor(ctx, ctx->regexp_ctor, args_len, args);
    JS_FreeValue(ctx, str);
    if (JS_IsException(rx)) {
    fail:
        JS_FreeValue(ctx, S);
        return JS_EXCEPTION;
    }
    result = JS_InvokeFree(ctx, rx, atom, 1, (JSValueConst *)&S);
    JS_FreeValue(ctx, S);
    return result;
}